

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::GraphicsState::GraphicsState(GraphicsState *this)

{
  memory_resource *pmVar1;
  long lVar2;
  
  (this->currentInsideMedium)._M_dataplus._M_p = (pointer)&(this->currentInsideMedium).field_2;
  (this->currentInsideMedium)._M_string_length = 0;
  (this->currentInsideMedium).field_2._M_local_buf[0] = '\0';
  (this->currentOutsideMedium)._M_dataplus._M_p = (pointer)&(this->currentOutsideMedium).field_2;
  (this->currentOutsideMedium)._M_string_length = 0;
  (this->currentOutsideMedium).field_2._M_local_buf[0] = '\0';
  this->currentMaterialIndex = 0;
  (this->currentMaterialName)._M_dataplus._M_p = (pointer)&(this->currentMaterialName).field_2;
  (this->currentMaterialName)._M_string_length = 0;
  (this->currentMaterialName).field_2._M_local_buf[0] = '\0';
  (this->areaLightName)._M_dataplus._M_p = (pointer)&(this->areaLightName).field_2;
  (this->areaLightName)._M_string_length = 0;
  (this->areaLightName).field_2._M_local_buf[0] = '\0';
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->areaLightParams).params.alloc.memoryResource = pmVar1;
  (this->areaLightParams).params.ptr = (ParsedParameter **)0x0;
  (this->areaLightParams).params.nAlloc = 0;
  (this->areaLightParams).params.nStored = 0;
  (this->areaLightParams).colorSpace = (RGBColorSpace *)0x0;
  (this->areaLightLoc).filename._M_len = 0;
  (this->areaLightLoc).filename._M_str = (char *)0x0;
  (this->areaLightLoc).line = 1;
  (this->areaLightLoc).column = 0;
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->shapeAttributes).alloc.memoryResource = pmVar1;
  (this->shapeAttributes).ptr = (ParsedParameter **)0x0;
  (this->shapeAttributes).nAlloc = 0;
  (this->shapeAttributes).nStored = 0;
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->lightAttributes).alloc.memoryResource = pmVar1;
  (this->lightAttributes).ptr = (ParsedParameter **)0x0;
  (this->lightAttributes).nAlloc = 0;
  (this->lightAttributes).nStored = 0;
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->materialAttributes).alloc.memoryResource = pmVar1;
  (this->materialAttributes).ptr = (ParsedParameter **)0x0;
  (this->materialAttributes).nAlloc = 0;
  (this->materialAttributes).nStored = 0;
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->mediumAttributes).alloc.memoryResource = pmVar1;
  (this->mediumAttributes).ptr = (ParsedParameter **)0x0;
  (this->mediumAttributes).nAlloc = 0;
  (this->mediumAttributes).nStored = 0;
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->textureAttributes).alloc.memoryResource = pmVar1;
  (this->textureAttributes).ptr = (ParsedParameter **)0x0;
  (this->textureAttributes).nAlloc = 0;
  (this->textureAttributes).nStored = 0;
  this->reverseOrientation = false;
  this->colorSpace = RGBColorSpace::sRGB;
  lVar2 = 0x2f8;
  do {
    pbrt::Transform::Transform
              ((Transform *)((long)&(this->currentInsideMedium)._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + 0x80;
  } while (lVar2 != 0x3f8);
  this->activeTransformBits = 3;
  this->transformStartTime = 0.0;
  this->transformEndTime = 1.0;
  this->currentMaterialIndex = 0;
  return;
}

Assistant:

ParsedScene::GraphicsState::GraphicsState() {
    currentMaterialIndex = 0;
}